

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

DivideBroadcastableLayerParams * __thiscall
CoreML::Specification::DivideBroadcastableLayerParams::New
          (DivideBroadcastableLayerParams *this,Arena *arena)

{
  DivideBroadcastableLayerParams *this_00;
  
  this_00 = (DivideBroadcastableLayerParams *)operator_new(0x18);
  DivideBroadcastableLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::DivideBroadcastableLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

DivideBroadcastableLayerParams* DivideBroadcastableLayerParams::New(::google::protobuf::Arena* arena) const {
  DivideBroadcastableLayerParams* n = new DivideBroadcastableLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}